

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  invalid_argument *ia;
  HelicsException *he;
  Player Player;
  int ret;
  Player *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdac;
  _Alloc_hider in_stack_fffffffffffffdb0;
  
  helics::apps::Player::Player
            ((Player *)in_stack_fffffffffffffdb0._M_p,in_stack_fffffffffffffdac,
             (char **)in_stack_fffffffffffffda0);
  bVar1 = helics::apps::App::isActive((App *)&stack0xfffffffffffffd70);
  if (bVar1) {
    helics::apps::App::run(&in_stack_fffffffffffffd40->super_App);
  }
  helics::apps::Player::~Player(in_stack_fffffffffffffd40);
  helics::cleanupHelicsLibrary();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    int ret = 0;
    try {
        helics::apps::Player Player(argc, argv);
        if (Player.isActive()) {
            Player.run();
        }
    }
    catch (const std::invalid_argument& ia) {
        std::cerr << ia.what() << std::endl;
        ret = -2;
    }
    catch (const helics::HelicsException& he) {
        std::cerr << he.what() << std::endl;
        ret = -4;
    }

    helics::cleanupHelicsLibrary();
    return ret;
}